

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_set_string.c
# Opt level: O0

int mpt_object_set_string(mpt_object *obj,char *name,char *val,char *sep)

{
  int iVar1;
  _mpt_vptr_convertable *p_Stack_50;
  int ret;
  wrapIter it;
  mpt_metatype *src;
  char *sep_local;
  char *val_local;
  char *name_local;
  mpt_object *obj_local;
  
  p_Stack_50 = &mpt_object_set_string::ctl;
  it._ctl._vptr = (_mpt_vptr_convertable *)0x0;
  it.src = (mpt_metatype *)val;
  it.val = sep;
  iVar1 = (*obj->_vptr->set_property)(obj,name,(mpt_convertable *)&stack0xffffffffffffffb0);
  it.sep = (char *)it._ctl._vptr;
  if (it._ctl._vptr != (_mpt_vptr_convertable *)0x0) {
    (**(code **)((it._ctl._vptr)->convert + 8))(it._ctl._vptr);
  }
  return iVar1;
}

Assistant:

extern int mpt_object_set_string(MPT_INTERFACE(object) *obj, const char *name, const char *val, const char *sep)
{
	static const MPT_INTERFACE_VPTR(convertable) ctl = {
		iterConv
	};
	MPT_INTERFACE(metatype) *src;
	struct wrapIter it;
	int ret;
	
	it._ctl._vptr = &ctl;
	it.src = 0;
	it.val = val;
	it.sep = sep;
	ret = obj->_vptr->set_property(obj, name, &it._ctl);
	if ((src = it.src)) {
		src->_vptr->unref(src);
	}
	return ret;
}